

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O0

void telnet_recv(telnet_t *telnet,char *buffer,size_t size)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 local_458 [8];
  telnet_event_t ev;
  Bytef local_428 [4];
  int rs;
  char inflate_buffer [1024];
  size_t size_local;
  char *buffer_local;
  telnet_t *telnet_local;
  
  if ((telnet->z == (z_stream *)0x0) || ((telnet->flags & 0x80) != 0)) {
    _process(telnet,buffer,size);
  }
  else {
    telnet->z->next_in = (Bytef *)buffer;
    telnet->z->avail_in = (uInt)size;
    telnet->z->next_out = local_428;
    telnet->z->avail_out = 0x400;
    do {
      bVar2 = true;
      if (telnet->z->avail_in == 0) {
        bVar2 = telnet->z->avail_out == 0;
      }
      if (!bVar2) {
        return;
      }
      ev.error.errcode = inflate(telnet->z,2);
      if ((ev.error.errcode == TELNET_EOK) || (ev.error.errcode == TELNET_EBADVAL)) {
        _process(telnet,(char *)local_428,0x400 - (ulong)telnet->z->avail_out);
      }
      else {
        uVar1 = zError(ev.error.errcode);
        _error(telnet,0x519,"telnet_recv",TELNET_ECOMPRESS,1,"inflate() failed: %s",uVar1);
      }
      telnet->z->next_out = local_428;
      telnet->z->avail_out = 0x400;
    } while (ev.error.errcode == TELNET_EOK);
    inflateEnd(telnet->z);
    free(telnet->z);
    telnet->z = (z_stream *)0x0;
    local_458._0_4_ = TELNET_EV_COMPRESS;
    local_458[4] = '\0';
    (*telnet->eh)(telnet,(telnet_event_t *)local_458,telnet->ud);
  }
  return;
}

Assistant:

void telnet_recv(telnet_t *telnet, const char *buffer,
		size_t size) {
#if defined(HAVE_ZLIB)
	/* if we have an inflate (decompression) zlib stream, use it */
	if (telnet->z != 0 && !(telnet->flags & TELNET_PFLAG_DEFLATE)) {
		char inflate_buffer[1024];
		int rs;

		/* initialize zlib state */
		telnet->z->next_in = (unsigned char*)buffer;
		telnet->z->avail_in = (unsigned int)size;
		telnet->z->next_out = (unsigned char *)inflate_buffer;
		telnet->z->avail_out = sizeof(inflate_buffer);

		/* inflate until buffer exhausted and all output is produced */
		while (telnet->z->avail_in > 0 || telnet->z->avail_out == 0) {
			/* reset output buffer */

			/* decompress */
			rs = inflate(telnet->z, Z_SYNC_FLUSH);

			/* process the decompressed bytes on success */
			if (rs == Z_OK || rs == Z_STREAM_END)
				_process(telnet, inflate_buffer, sizeof(inflate_buffer) -
						telnet->z->avail_out);
			else
				_error(telnet, __LINE__, __func__, TELNET_ECOMPRESS, 1,
						"inflate() failed: %s", zError(rs));

			/* prepare output buffer for next run */
			telnet->z->next_out = (unsigned char *)inflate_buffer;
			telnet->z->avail_out = sizeof(inflate_buffer);

			/* on error (or on end of stream) disable further inflation */
			if (rs != Z_OK) {
				telnet_event_t ev;

				/* disable compression */
				inflateEnd(telnet->z);
				free(telnet->z);
				telnet->z = 0;

				/* send event */
				ev.type = TELNET_EV_COMPRESS;
				ev.compress.state = 0;
				telnet->eh(telnet, &ev, telnet->ud);

				break;
			}
		}

	/* COMPRESS2 is not negotiated, just process */
	} else
#endif /* defined(HAVE_ZLIB) */
		_process(telnet, buffer, size);
}